

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ObjRecognizeMuxLits(Gia_Man_t *p,Gia_Obj_t *pNode,int *iLitT,int *iLitE)

{
  int iVar1;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  Gia_Obj_t *local_30;
  Gia_Obj_t *local_28;
  
  pObj = Gia_ObjRecognizeMux(pNode,&local_28,&local_30);
  if (pObj != (Gia_Obj_t *)0x0) {
    iVar1 = Gia_Obj2Lit(p,local_28);
    *iLitT = iVar1;
    iVar1 = Gia_Obj2Lit(p,local_30);
    *iLitE = iVar1;
    iVar1 = Gia_Obj2Lit(p,pObj);
    return iVar1;
  }
  __assert_fail("pCtrl != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x421,"int Gia_ObjRecognizeMuxLits(Gia_Man_t *, Gia_Obj_t *, int *, int *)");
}

Assistant:

int Gia_ObjRecognizeMuxLits( Gia_Man_t * p, Gia_Obj_t * pNode, int * iLitT, int * iLitE )
{
    Gia_Obj_t * pNodeT, * pNodeE;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    assert( pCtrl != NULL );
    *iLitT = Gia_Obj2Lit( p, pNodeT );
    *iLitE = Gia_Obj2Lit( p, pNodeE );
    return Gia_Obj2Lit( p, pCtrl );
}